

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O2

void __thiscall wasm::UniqueNameMapper::popLabelName(UniqueNameMapper *this,Name name)

{
  pointer *ppNVar1;
  pointer pNVar2;
  mapped_type *__k;
  mapped_type *pmVar3;
  undefined1 local_20 [8];
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_20 = name.super_IString.str._M_len;
  pNVar2 = (this->labelStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pNVar2[-1].super_IString.str._M_str == (char *)name_local.super_IString.str._M_len) {
    (this->labelStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar2 + -1;
    __k = std::
          map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
          ::operator[](&this->reverseLabelMapping,(key_type *)local_20);
    pmVar3 = std::
             map<wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
             ::operator[](&this->labelMappings,__k);
    ppNVar1 = &(pmVar3->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + -1;
    return;
  }
  __assert_fail("labelStack.back() == name",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/parsing.cpp"
                ,0x4a,"void wasm::UniqueNameMapper::popLabelName(Name)");
}

Assistant:

void UniqueNameMapper::popLabelName(Name name) {
  assert(labelStack.back() == name);
  labelStack.pop_back();
  labelMappings[reverseLabelMapping[name]].pop_back();
}